

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void av1_set_variance_partition_thresholds(AV1_COMP *cpi,int qindex,int content_lowsumdiff)

{
  int in_ESI;
  long in_RDI;
  _Bool unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  uint64_t in_stack_00000010;
  int64_t *in_stack_00000018;
  SPEED_FEATURES *sf;
  int in_stack_00000040;
  
  if (*(char *)(in_RDI + 0x60950) == '\x02') {
    set_vbp_thresholds((AV1_COMP *)sf,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
                       in_stack_00000008,unaff_retaddr_00,(int)cpi,unaff_retaddr,in_stack_00000040);
    *(long *)(in_RDI + 0x81360) = (long)((in_ESI >> 3) + 0xf);
  }
  return;
}

Assistant:

void av1_set_variance_partition_thresholds(AV1_COMP *cpi, int qindex,
                                           int content_lowsumdiff) {
  SPEED_FEATURES *const sf = &cpi->sf;
  if (sf->part_sf.partition_search_type != VAR_BASED_PARTITION) {
    return;
  } else {
    set_vbp_thresholds(cpi, cpi->vbp_info.thresholds, 0, qindex,
                       content_lowsumdiff, 0, 0, 0, 0);
    // The threshold below is not changed locally.
    cpi->vbp_info.threshold_minmax = 15 + (qindex >> 3);
  }
}